

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_sink.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::CodeSinkingPass::IsSyncOnUniform(CodeSinkingPass *this,uint32_t mem_semantics_id)

{
  IRContext *this_00;
  Constant *this_01;
  int iVar1;
  uint32_t uVar2;
  const_iterator cVar3;
  undefined4 extraout_var;
  key_type_conflict local_14;
  
  this_00 = (this->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
    IRContext::BuildConstantManager(this_00);
  }
  cVar3 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(((this_00->constant_mgr_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                    .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>.
                   _M_head_impl)->id_to_const_val_)._M_h,&local_14);
  if ((cVar3.
       super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (this_01 = *(Constant **)
                 ((long)cVar3.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
                        ._M_cur + 0x10), this_01 != (Constant *)0x0)) {
    iVar1 = (*this_01->_vptr_Constant[0xe])(this_01);
    if (CONCAT44(extraout_var,iVar1) != 0) {
      uVar2 = analysis::Constant::GetU32(this_01);
      return (bool)((uVar2 & 0xe) != 0 & (byte)uVar2 >> 6);
    }
    __assert_fail("mem_semantics_const->AsIntConstant() && \"Memory semantics should be an integer.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/code_sink.cpp"
                  ,0x102,"bool spvtools::opt::CodeSinkingPass::IsSyncOnUniform(uint32_t) const");
  }
  __assert_fail("mem_semantics_const != nullptr && \"Expecting memory semantics id to be a constant.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/code_sink.cpp"
                ,0x100,"bool spvtools::opt::CodeSinkingPass::IsSyncOnUniform(uint32_t) const");
}

Assistant:

bool CodeSinkingPass::IsSyncOnUniform(uint32_t mem_semantics_id) const {
  const analysis::Constant* mem_semantics_const =
      context()->get_constant_mgr()->FindDeclaredConstant(mem_semantics_id);
  assert(mem_semantics_const != nullptr &&
         "Expecting memory semantics id to be a constant.");
  assert(mem_semantics_const->AsIntConstant() &&
         "Memory semantics should be an integer.");
  uint32_t mem_semantics_int = mem_semantics_const->GetU32();

  // If it does not affect uniform memory, then it is does not apply to uniform
  // memory.
  if ((mem_semantics_int & uint32_t(spv::MemorySemanticsMask::UniformMemory)) ==
      0) {
    return false;
  }

  // Check if there is an acquire or release.  If so not, this it does not add
  // any memory constraints.
  return (mem_semantics_int &
          uint32_t(spv::MemorySemanticsMask::Acquire |
                   spv::MemorySemanticsMask::AcquireRelease |
                   spv::MemorySemanticsMask::Release)) != 0;
}